

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcParser::init_local_ctx(CTcParser *this)

{
  int iVar1;
  CTcParser *in_RDI;
  
  if ((in_RDI->field_0x1e8 & 1) == 0) {
    in_RDI->field_0x1e8 = in_RDI->field_0x1e8 & 0xfe | 1;
    iVar1 = alloc_local(in_RDI);
    in_RDI->local_ctx_var_num_ = iVar1;
  }
  return;
}

Assistant:

void CTcParser::init_local_ctx()
{
    /* if I already have a local variable context, there's nothing to do */
    if (has_local_ctx_)
        return;

    /* note that we now require a local variable context object */
    has_local_ctx_ = TRUE;

    /* create the local context variable */
    local_ctx_var_num_ = alloc_local();
}